

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  float fVar1;
  int iVar2;
  char *__format;
  double dVar3;
  allocator local_142;
  allocator local_141;
  float local_140;
  float local_13c;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  sigaction sa;
  
  progname = *argv;
  local_13c = 1.0;
  local_140 = 0.0;
  while( true ) {
    while( true ) {
      iVar2 = getopt(argc,argv,"f:F:vh");
      if (iVar2 != 0x66) break;
      dVar3 = atof(_optarg);
      local_13c = (float)dVar3;
    }
    if (iVar2 == -1) break;
    if (iVar2 != 0x46) {
      if (iVar2 == 0x76) {
        fprintf(_stderr,"%s : version: %s\n",*argv,"");
      }
      else {
        help();
      }
LAB_001032af:
      exit(1);
    }
    dVar3 = atof(_optarg);
    local_140 = (float)dVar3;
  }
  if ((local_13c < 0.0) || (1.0 < local_13c)) {
    __format = "FATAL: Relative secondary factor %f must lie within range [0, 1]\n";
    fVar1 = local_13c;
  }
  else {
    if (0.0 <= local_140) {
      if ((local_13c < 1.0) && (0.0 < local_140)) {
        fwrite("WARNING: Relative secondary and absolute factors are incompatible\nINFO: Ignoring relative secondary factor\n"
               ,0x6b,1,_stderr);
        local_13c = 1.0;
      }
      memset(&sa,0,0x98);
      sigemptyset((sigset_t *)&sa.sa_mask);
      sa.__sigaction_handler.sa_handler = segfault_sigaction;
      sa.sa_flags = 4;
      sigaction(0xb,(sigaction *)&sa,(sigaction *)0x0);
      std::__cxx11::string::string((string *)&local_d8,"",(allocator *)&local_118);
      std::__cxx11::string::string((string *)&local_f8,"",(allocator *)&local_138);
      initstreams(&local_d8,&local_f8);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::string((string *)&local_118,progname,&local_141);
      std::__cxx11::string::string((string *)&local_138,"INFO",&local_142);
      logprintf(&local_118,&local_138,"starting process...\n");
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::~string((string *)&local_118);
      placalc::doit(local_13c,local_140);
      std::__cxx11::string::string((string *)&local_118,progname,&local_141);
      std::__cxx11::string::string((string *)&local_138,"INFO",&local_142);
      logprintf(&local_118,&local_138,"finishing process...\n");
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::~string((string *)&local_118);
      return 0;
    }
    __format = "FATAL: Absolute factor %f must be positive value\n";
    fVar1 = local_140;
  }
  fprintf(_stderr,__format,(double)fVar1);
  goto LAB_001032af;
}

Assistant:

int main(int argc, char *argv[]) {

  int opt;
  float relativeSecondaryFactor = 1.;
  float absoluteFactor = 0.0;
  progname = argv[0];
  while ((opt = getopt(argc, argv, "f:F:vh")) != -1) {
    switch (opt) {
      case 'f':
	relativeSecondaryFactor = atof(optarg);
	break;
      case 'F':
	absoluteFactor = atof(optarg);
	break;
      case 'v':
	fprintf(stderr, "%s : version: %s\n", argv[0], VERSION);
	exit(EXIT_FAILURE);
	break;
      case 'h':
      default:
	help();
	exit(EXIT_FAILURE);
    }
  }

  if (relativeSecondaryFactor < 0.0 || relativeSecondaryFactor > 1.0) {
    fprintf(stderr,
	    "FATAL: Relative secondary factor %f must lie within range [0, 1]\n",
	    relativeSecondaryFactor);
    exit(EXIT_FAILURE);
  }
  if (absoluteFactor < 0.0) {
    fprintf(stderr, "FATAL: Absolute factor %f must be positive value\n",
	    absoluteFactor);
    exit(EXIT_FAILURE);
  }
  if (relativeSecondaryFactor < 1.0 && absoluteFactor > 0.0) {
    fprintf(stderr,
	    "WARNING: Relative secondary and absolute factors are incompatible\n"
	    "INFO: Ignoring relative secondary factor\n");
    relativeSecondaryFactor = 1.;
  }

#if !defined(_MSC_VER) && !defined(__MINGW32__)
  struct sigaction sa;

  memset(&sa, 0, sizeof(struct sigaction));
  sigemptyset(&sa.sa_mask);
  sa.sa_sigaction = segfault_sigaction;
  sa.sa_flags = SA_SIGINFO;

  sigaction(SIGSEGV, &sa, NULL);
#endif

  try {
    initstreams();
    logprintf(progname, "INFO", "starting process...\n");
    placalc::doit(relativeSecondaryFactor, absoluteFactor);
    logprintf(progname, "INFO", "finishing process...\n");
  } catch (std::bad_alloc&) {
    fprintf(stderr, "FATAL: %s: Memory allocation failed.\n", progname);
    exit(EXIT_FAILURE);
  }

}